

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,ConstPixelBufferAccess *access,
          qpImageCompressionMode compression)

{
  ConstPixelBufferAccess *this_00;
  bool bVar1;
  ChannelOrder CVar2;
  ConstPixelBufferAccess depthAccess;
  Vec4 stencilBias;
  Vec4 stencilScale;
  Vec4 depthBias;
  Vec4 depthScale;
  ConstPixelBufferAccess stencilAccess;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  this_00 = &this->m_access;
  ConstPixelBufferAccess::ConstPixelBufferAccess(this_00,access);
  (this->m_scale).m_data[0] = 1.0;
  (this->m_scale).m_data[1] = 1.0;
  (this->m_scale).m_data[2] = 1.0;
  (this->m_scale).m_data[3] = 1.0;
  (this->m_bias).m_data[0] = 0.0;
  (this->m_bias).m_data[1] = 0.0;
  (this->m_bias).m_data[2] = 0.0;
  (this->m_bias).m_data[3] = 0.0;
  this->m_compression = compression;
  bVar1 = isCombinedDepthStencilType((this->m_access).m_format.type);
  if (bVar1) {
    CVar2 = (this_00->m_format).order;
    if (CVar2 == S) {
      getEffectiveDepthStencilAccess(&depthAccess,this_00,MODE_STENCIL);
    }
    else {
      if (CVar2 != D) goto LAB_001ebbe4;
      getEffectiveDepthStencilAccess(&depthAccess,this_00,MODE_DEPTH);
    }
    (this->m_access).m_data = depthAccess.m_data;
    *(undefined8 *)((this->m_access).m_size.m_data + 2) = depthAccess._16_8_;
    *(undefined8 *)((this->m_access).m_pitch.m_data + 1) = depthAccess.m_pitch.m_data._4_8_;
    this_00->m_format = depthAccess.m_format;
    *(undefined8 *)(this->m_access).m_size.m_data = depthAccess.m_size.m_data._0_8_;
  }
  CVar2 = (this_00->m_format).order;
LAB_001ebbe4:
  if (CVar2 == DS) {
    getEffectiveDepthStencilAccess(&depthAccess,this_00,MODE_DEPTH);
    getEffectiveDepthStencilAccess(&stencilAccess,this_00,MODE_STENCIL);
    Vector<float,_4>::Vector(&depthScale);
    Vector<float,_4>::Vector(&depthBias);
    Vector<float,_4>::Vector(&stencilScale);
    Vector<float,_4>::Vector(&stencilBias);
    computePixelScaleBias(&depthAccess,&depthScale,&depthBias);
    computePixelScaleBias(&stencilAccess,&stencilScale,&stencilBias);
    (this->m_scale).m_data[0] = depthScale.m_data[0];
    (this->m_scale).m_data[1] = stencilScale.m_data[0];
    (this->m_scale).m_data[2] = 0.0;
    (this->m_scale).m_data[3] = 0.0;
    (this->m_bias).m_data[0] = depthBias.m_data[0];
    (this->m_bias).m_data[1] = stencilBias.m_data[0];
    (this->m_bias).m_data[2] = 0.0;
    (this->m_bias).m_data[3] = 0.0;
  }
  else {
    computePixelScaleBias(this_00,&this->m_scale,&this->m_bias);
  }
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const ConstPixelBufferAccess& access, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(access)
	, m_scale		(1.0f, 1.0f, 1.0f, 1.0f)
	, m_bias		(0.0f, 0.0f, 0.0f, 0.0f)
	, m_compression	(compression)
{
	// Simplify combined formats that only use a single channel
	if (tcu::isCombinedDepthStencilType(m_access.getFormat().type))
	{
		if (m_access.getFormat().order == tcu::TextureFormat::D)
			m_access = tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_DEPTH);
		else if (m_access.getFormat().order == tcu::TextureFormat::S)
			m_access = tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_STENCIL);
	}

	// Implicit scale and bias
	if (m_access.getFormat().order != tcu::TextureFormat::DS)
		computePixelScaleBias(m_access, m_scale, m_bias);
	else
	{
		// Pack D and S bias and scale to R and G
		const ConstPixelBufferAccess	depthAccess		= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_DEPTH);
		const ConstPixelBufferAccess	stencilAccess	= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_STENCIL);
		tcu::Vec4						depthScale;
		tcu::Vec4						depthBias;
		tcu::Vec4						stencilScale;
		tcu::Vec4						stencilBias;

		computePixelScaleBias(depthAccess, depthScale, depthBias);
		computePixelScaleBias(stencilAccess, stencilScale, stencilBias);

		m_scale = tcu::Vec4(depthScale.x(), stencilScale.x(), 0.0f, 0.0f);
		m_bias = tcu::Vec4(depthBias.x(), stencilBias.x(), 0.0f, 0.0f);
	}
}